

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_PCM.cpp
# Opt level: O2

h__Reader * __thiscall
AS_02::PCM::MXFReader::h__Reader::ReadFrame
          (h__Reader *this,ui32_t FrameNum,FrameBuffer *FrameBuf,AESDecContext *param_3,
          HMACContext *param_4)

{
  char cVar1;
  int64_t iVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  long lVar4;
  undefined1 *puVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  Result_t aRStack_98 [104];
  
  lVar4 = CONCAT44(in_register_00000034,FrameNum);
  cVar1 = (**(code **)(**(long **)(lVar4 + 0x10) + 0x40))();
  if (cVar1 == '\0') {
    puVar5 = Kumu::RESULT_INIT;
  }
  else {
    if ((uint)FrameBuf < *(uint *)(lVar4 + 0x510)) {
      lVar7 = *(long *)(lVar4 + 0x500);
      if (lVar7 == 0) {
        __assert_fail("m_ClipEssenceBegin",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_PCM.cpp"
                      ,0xa6,
                      "ASDCP::Result_t AS_02::PCM::MXFReader::h__Reader::ReadFrame(ui32_t, ASDCP::PCM::FrameBuffer &, ASDCP::AESDecContext *, ASDCP::HMACContext *)"
                     );
      }
      uVar6 = *(uint *)(lVar4 + 0x514);
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
      iVar2 = Kumu::IFileReader::TellPosition(*(IFileReader **)(lVar4 + 0x10));
      lVar10 = (ulong)uVar6 * ((ulong)FrameBuf & 0xffffffff);
      lVar7 = lVar7 + lVar10;
      if (iVar2 != lVar7) {
        (**(code **)(**(long **)(lVar4 + 0x10) + 0x28))(aRStack_98,*(long **)(lVar4 + 0x10),lVar7,0)
        ;
        Kumu::Result_t::operator=((Result_t *)this,aRStack_98);
        Kumu::Result_t::~Result_t(aRStack_98);
      }
      if (*(int *)&(this->super_h__AS02Reader).
                   super_TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>.
                   _vptr_TrackFileReader < 0) {
        return this;
      }
      uVar8 = *(long *)(lVar4 + 0x508) - lVar10;
      uVar9 = uVar8 & 0xffffffff;
      if (*(uint *)(lVar4 + 0x514) <= uVar8) {
        uVar9 = (ulong)*(uint *)(lVar4 + 0x514);
      }
      uVar6 = (uint)uVar9;
      (**(code **)(**(long **)(lVar4 + 0x10) + 0x38))
                (aRStack_98,*(long **)(lVar4 + 0x10),*(undefined8 *)(param_3 + 8),uVar9,0);
      Kumu::Result_t::operator=((Result_t *)this,aRStack_98);
      Kumu::Result_t::~Result_t(aRStack_98);
      if (*(int *)&(this->super_h__AS02Reader).
                   super_TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>.
                   _vptr_TrackFileReader < 0) {
        return this;
      }
      *(uint *)(param_3 + 0x18) = uVar6;
      uVar3 = *(uint *)(param_3 + 0x10) - uVar6;
      if (*(uint *)(param_3 + 0x10) < uVar6 || uVar3 == 0) {
        return this;
      }
      memset((void *)(uVar9 + *(long *)(param_3 + 8)),0,(ulong)uVar3);
      return this;
    }
    puVar5 = ASDCP::RESULT_RANGE;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar5);
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::PCM::MXFReader::h__Reader::ReadFrame(ui32_t FrameNum, ASDCP::PCM::FrameBuffer& FrameBuf,
					    ASDCP::AESDecContext*, ASDCP::HMACContext*)
{
  if ( ! m_File->IsOpen() )
    {
      return RESULT_INIT;
    }

  if ( ! ( FrameNum < m_ClipDurationFrames ) )
    {
      return RESULT_RANGE;
    }

  assert(m_ClipEssenceBegin);
  ui64_t offset = static_cast<ui64_t>(FrameNum) * static_cast<ui64_t>(m_BytesPerFrame);
  ui64_t position = m_ClipEssenceBegin + offset;
  Result_t result = RESULT_OK;

  if ( m_File->TellPosition() != static_cast<Kumu::fpos_t>(position) )
    {
      result = m_File->Seek(position);
    }

  if ( KM_SUCCESS(result) )
    {
      ui64_t remainder = m_ClipSize - offset;
      ui32_t read_size = ( remainder < m_BytesPerFrame ) ? remainder : m_BytesPerFrame;
      result = m_File->Read(FrameBuf.Data(), read_size);

      if ( KM_SUCCESS(result) )
	{
	  FrameBuf.Size(read_size);

	  if ( read_size < FrameBuf.Capacity() )
	    {
	      memset(FrameBuf.Data() + FrameBuf.Size(), 0, FrameBuf.Capacity() - FrameBuf.Size());
	    }
	}
    }

  return result;
}